

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::
insert<google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::const_iterator>
          (Map<google::protobuf::MapKey,google::protobuf::MapValueRef> *this,const_iterator first,
          const_iterator last)

{
  Node *pNVar1;
  iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
  local_68;
  pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_bool>
  local_48;
  
  local_68.node_ = first.it_.node_;
  local_68.m_ = first.it_.m_;
  local_68.bucket_index_ = first.it_.bucket_index_;
  if (first.it_.node_ != last.it_.node_) {
    do {
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      FindHelper<google::protobuf::MapKey>
                ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>,_unsigned_long>
                  *)&local_48,(InnerMap *)this,(MapKey *)local_68.node_,(TreeIterator *)0x0);
      pNVar1 = local_68.node_;
      if (local_48.first.node_ == (Node *)0x0) {
        InnerMap::insert<google::protobuf::MapKey_const&>(&local_48,this,(MapKey *)local_68.node_);
        *(undefined4 *)&(local_48.first.node_)->field_0x30 = *(undefined4 *)&pNVar1->field_0x30;
        *(undefined8 *)&(local_48.first.node_)->field_0x28 = *(undefined8 *)&pNVar1->field_0x28;
      }
      Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
      iterator_base<const_google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
      ::operator++(&local_68);
    } while (local_68.node_ != last.it_.node_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }